

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O3

int32_t ucal_getWindowsTimeZoneID_63
                  (UChar *id,int32_t len,UChar *winid,int32_t winidCapacity,UErrorCode *status)

{
  undefined4 uVar1;
  int32_t iVar2;
  UnicodeString resultWinID;
  Char16Ptr local_c0;
  UChar *local_b8;
  UnicodeString local_a8;
  UnicodeString local_68;
  
  iVar2 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_a8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
    local_a8.fUnion.fStackFields.fLengthAndFlags = 2;
    icu_63::UnicodeString::UnicodeString(&local_68,id,len);
    icu_63::TimeZone::getWindowsID(&local_68,&local_a8,status);
    icu_63::UnicodeString::~UnicodeString(&local_68);
    iVar2 = 0;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar1 = local_a8.fUnion.fFields.fLength;
      if (-1 < local_a8.fUnion.fStackFields.fLengthAndFlags) {
        uVar1 = (int)local_a8.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if (0 < (int)uVar1) {
        local_c0.p_ = winid;
        icu_63::UnicodeString::extract(&local_a8,&local_c0,winidCapacity,status);
        local_b8 = local_c0.p_;
        iVar2 = uVar1;
      }
    }
    icu_63::UnicodeString::~UnicodeString(&local_a8);
  }
  return iVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucal_getWindowsTimeZoneID(const UChar* id, int32_t len, UChar* winid, int32_t winidCapacity, UErrorCode* status) {
    if (U_FAILURE(*status)) {
        return 0;
    }

    int32_t resultLen = 0;
    UnicodeString resultWinID;

    TimeZone::getWindowsID(UnicodeString(id, len), resultWinID, *status);
    if (U_SUCCESS(*status) && resultWinID.length() > 0) {
        resultLen = resultWinID.length();
        resultWinID.extract(winid, winidCapacity, *status);
    }

    return resultLen;
}